

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::UniformLocationTests::init(UniformLocationTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  Stage SVar6;
  ShaderStage SVar7;
  ShaderStage SVar8;
  ShaderStage SVar9;
  ShaderStage SVar10;
  ShaderStage SVar11;
  ShaderStage SVar12;
  ShaderStage SVar13;
  int extraout_EAX;
  TestContext *pTVar14;
  CommandLine *this_00;
  TestNode *pTVar15;
  char *pcVar16;
  UniformLocationCase *pUVar17;
  RenderContext *pRVar18;
  char *pcVar19;
  TestCaseGroup *pTVar20;
  StructType *pSVar21;
  TestNode *pTVar22;
  reference pvVar23;
  ContextInfo *pCVar24;
  size_type sVar25;
  const_reference ppTVar26;
  ShaderStage SVar27;
  ShaderStage SVar28;
  ShaderStage declareLocation_;
  int local_f90;
  int local_ed0;
  int local_ec0;
  int local_eb0;
  int local_ea0;
  int local_c64;
  bool local_c05;
  int local_b2c;
  undefined1 local_b28 [4];
  int ndx_1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> negativeCases_1;
  ShaderLibrary shaderLibrary_1;
  undefined1 local_af0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> es32Group;
  undefined1 local_ad8 [4];
  int ndx;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> negativeCases;
  ShaderLibrary shaderLibrary;
  undefined1 local_aa0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> es31Group;
  undefined1 local_a88 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> negativeGroup;
  undefined1 local_a60 [8];
  UniformInfo uniform_3;
  Stage verifyLoc_1;
  Stage declareLoc_1;
  Stage layoutLoc_1;
  int count;
  vector<int,_std::allocator<int>_> locations;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config_6;
  undefined1 local_9d8 [8];
  string name_6;
  undefined1 local_9b0 [4];
  int caseNdx_2;
  Random rng_5;
  TestCaseGroup *group_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  undefined1 local_949;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  VarType local_908;
  UniformInfo local_8f0;
  undefined1 local_8c8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  undefined1 local_868 [8];
  string name_5;
  int stageNdx_3;
  DataType type_3;
  int primitiveNdx_3;
  TestCaseGroup *group_5;
  UniformInfo local_818;
  VarType local_7f0;
  UniformInfo local_7d8;
  VarType local_7b0;
  UniformInfo local_798;
  VarType local_770;
  UniformInfo local_758;
  undefined1 local_730 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config_4;
  VarType local_700;
  VarType local_6e8;
  VarType local_6d0;
  VarType local_6b8;
  VarType local_6a0;
  VarType local_688;
  VarType local_670;
  VarType local_658;
  VarType local_640;
  VarType local_628;
  VarType local_610;
  VarType local_5f8;
  VarType local_5e0;
  StructType *local_5c8;
  StructType *testTypes [4];
  Stage verifyLocs [4];
  Stage declareLocs [4];
  deUint32 tempDecl [4];
  Stage layoutLocs [4];
  undefined1 local_560 [4];
  int baseLoc;
  undefined1 local_540 [8];
  string name_4;
  undefined1 local_518 [4];
  int caseNdx_1;
  Random rng_4;
  TestCaseGroup *group_4;
  UniformInfo local_4e8;
  undefined1 local_4c0 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config_3;
  VarType local_490;
  VarType local_478;
  VarType local_460;
  VarType local_448;
  StructType *local_430;
  StructType *structProto;
  int location;
  Stage verifyLoc;
  Stage declareLoc;
  Stage layoutLoc;
  undefined1 local_3f8 [8];
  string name_3;
  undefined1 local_3d0 [4];
  int caseNdx;
  Random rng_3;
  TestCaseGroup *group_3;
  VarType local_3a0;
  VarType local_388;
  undefined1 local_370 [8];
  UniformInfo uniform_2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config_2;
  int arraySize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  string name_2;
  int stageNdx_2;
  DataType type_2;
  int primitiveNdx_2;
  Random rng_2;
  TestCaseGroup *group_2;
  VarType local_288;
  undefined1 local_270 [8];
  UniformInfo uniform_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string name_1;
  int stageNdx_1;
  DataType type_1;
  int primitiveNdx_1;
  Random rng_1;
  TestCaseGroup *group_1;
  undefined1 local_188 [8];
  UniformInfo uniform;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string name;
  int stageNdx;
  DataType type;
  int primitiveNdx;
  Random rng;
  TestCaseGroup *group;
  int maxPrimitiveTypeNdx;
  DataType primitiveTypes [28];
  int baseSeed;
  int maxLocations;
  char *stageNames [2];
  ShaderStage checkStages [2];
  UniformLocationTests *this_local;
  
  stageNames[1] = (char *)0x200000001;
  _baseSeed = "vertex";
  stageNames[0] = "fragment";
  pTVar14 = gles31::Context::getTestContext((this->super_TestCaseGroup).m_context);
  this_00 = tcu::TestContext::getCommandLine(pTVar14);
  iVar4 = tcu::CommandLine::getBaseSeed(this_00);
  primitiveTypes[0x16] = TYPE_FLOAT_MAT4;
  primitiveTypes[0x17] = TYPE_SAMPLER_2D;
  primitiveTypes[0x18] = TYPE_INT_SAMPLER_2D;
  primitiveTypes[0x19] = TYPE_UINT_SAMPLER_2D;
  primitiveTypes[0x12] = TYPE_FLOAT_MAT3;
  primitiveTypes[0x13] = TYPE_FLOAT_MAT3X4;
  primitiveTypes[0x14] = TYPE_FLOAT_MAT4X2;
  primitiveTypes[0x15] = TYPE_FLOAT_MAT4X3;
  primitiveTypes[0xe] = TYPE_FLOAT_MAT2;
  primitiveTypes[0xf] = TYPE_FLOAT_MAT2X3;
  primitiveTypes[0x10] = TYPE_FLOAT_MAT2X4;
  primitiveTypes[0x11] = TYPE_FLOAT_MAT3X2;
  primitiveTypes[10] = TYPE_BOOL;
  primitiveTypes[0xb] = TYPE_BOOL_VEC2;
  primitiveTypes[0xc] = TYPE_BOOL_VEC3;
  primitiveTypes[0xd] = TYPE_BOOL_VEC4;
  primitiveTypes[6] = TYPE_UINT;
  primitiveTypes[7] = TYPE_UINT_VEC2;
  primitiveTypes[8] = TYPE_UINT_VEC3;
  primitiveTypes[9] = TYPE_UINT_VEC4;
  primitiveTypes[2] = TYPE_INT;
  primitiveTypes[3] = TYPE_INT_VEC2;
  primitiveTypes[4] = TYPE_INT_VEC3;
  primitiveTypes[5] = TYPE_INT_VEC4;
  primitiveTypes[0] = TYPE_FLOAT_VEC3;
  primitiveTypes[1] = TYPE_FLOAT_VEC4;
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Location specified with use, single shader stage");
  de::Random::Random((Random *)&type,iVar4 + 0x1001);
  tcu::TestNode::addChild((TestNode *)this,pTVar15);
  for (stageNdx = 0; stageNdx < 0x1c; stageNdx = stageNdx + 1) {
    name.field_2._12_4_ = primitiveTypes[(long)stageNdx + -2];
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 2;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      pcVar16 = glu::getDataTypeName(name.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,pcVar16,
                 (allocator<char> *)
                 ((long)&config.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_120,&local_140,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     &local_120,*(char **)(&baseSeed + (long)(int)name.field_2._8_4_ * 2));
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&config.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)&uniform.checkLocation);
      createVarType((VarType *)&group_1,name.field_2._12_4_);
      SVar7 = checkStages[(long)(int)name.field_2._8_4_ + -2];
      iVar5 = de::Random::getInt((Random *)&type,0,0x3ff);
      Functional::anon_unknown_0::UniformInfo::UniformInfo
                ((UniformInfo *)local_188,(VarType *)&group_1,SVar7,SVar7,SVar7,iVar5);
      glu::VarType::~VarType((VarType *)&group_1);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)&uniform.checkLocation,(value_type *)local_188);
      pUVar17 = (UniformLocationCase *)operator_new(0x90);
      pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      pcVar16 = (char *)std::__cxx11::string::c_str();
      pcVar19 = (char *)std::__cxx11::string::c_str();
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&uniform.checkLocation);
      tcu::TestNode::addChild(pTVar15,(TestNode *)pUVar17);
      Functional::anon_unknown_0::UniformInfo::~UniformInfo((UniformInfo *)local_188);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&uniform.checkLocation);
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  de::Random::~Random((Random *)&type);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "array","Array location specified with use, single shader stage");
  rng_1.m_rnd._8_8_ = pTVar20;
  de::Random::Random((Random *)&type_1,iVar4 + 0x2001);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)rng_1.m_rnd._8_8_);
  for (stageNdx_1 = 0; stageNdx_1 < 0x1c; stageNdx_1 = stageNdx_1 + 1) {
    DVar1 = primitiveTypes[(long)stageNdx_1 + -2];
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 2;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      pcVar16 = glu::getDataTypeName(DVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,pcVar16,
                 (allocator<char> *)
                 ((long)&config_1.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_208,&local_228,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &local_208,*(char **)(&baseSeed + (long)(int)name_1.field_2._12_4_ * 2));
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&config_1.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)&uniform_1.checkLocation);
      createVarType((VarType *)&group_2,DVar1);
      glu::VarType::VarType(&local_288,(VarType *)&group_2,8);
      SVar7 = checkStages[(long)(int)name_1.field_2._12_4_ + -2];
      iVar5 = de::Random::getInt((Random *)&type_1,0,0x3f7);
      Functional::anon_unknown_0::UniformInfo::UniformInfo
                ((UniformInfo *)local_270,&local_288,SVar7,SVar7,SVar7,iVar5);
      glu::VarType::~VarType(&local_288);
      glu::VarType::~VarType((VarType *)&group_2);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)&uniform_1.checkLocation,(value_type *)local_270);
      uVar3 = rng_1.m_rnd._8_8_;
      pUVar17 = (UniformLocationCase *)operator_new(0x90);
      pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      pcVar16 = (char *)std::__cxx11::string::c_str();
      pcVar19 = (char *)std::__cxx11::string::c_str();
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&uniform_1.checkLocation);
      tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)pUVar17);
      Functional::anon_unknown_0::UniformInfo::~UniformInfo((UniformInfo *)local_270);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&uniform_1.checkLocation);
      std::__cxx11::string::~string((string *)local_1e8);
    }
  }
  de::Random::~Random((Random *)&type_1);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_array","Array location specified with use, single shader stage");
  rng_2.m_rnd._8_8_ = pTVar20;
  de::Random::Random((Random *)&type_2,iVar4 + 0x3001);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)rng_2.m_rnd._8_8_);
  for (stageNdx_2 = 0; stageNdx_2 < 0x1c; stageNdx_2 = stageNdx_2 + 1) {
    DVar1 = primitiveTypes[(long)stageNdx_2 + -2];
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 2;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      pcVar16 = glu::getDataTypeName(DVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arraySize,pcVar16,
                 (allocator<char> *)
                 ((long)&config_2.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arraySize
                     ,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     &local_308,*(char **)(&baseSeed + (long)(int)name_2.field_2._12_4_ * 2));
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&arraySize);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&config_2.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar5 = glu::getDataTypeScalarSize(DVar1);
      local_c05 = true;
      if (iVar5 < 5) {
        local_c05 = glu::isDataTypeSampler(DVar1);
      }
      config_2.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = ((byte)~local_c05 & 1) * 4 + 3;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)&uniform_2.checkLocation);
      createVarType((VarType *)&group_3,DVar1);
      glu::VarType::VarType
                (&local_3a0,(VarType *)&group_3,
                 (int)config_2.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      glu::VarType::VarType
                (&local_388,&local_3a0,
                 (int)config_2.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      SVar7 = checkStages[(long)(int)name_2.field_2._12_4_ + -2];
      iVar5 = de::Random::getInt((Random *)&type_2,0,
                                 0x3ff - (int)config_2.
                                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                         (int)config_2.
                                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Functional::anon_unknown_0::UniformInfo::UniformInfo
                ((UniformInfo *)local_370,&local_388,SVar7,SVar7,SVar7,iVar5);
      glu::VarType::~VarType(&local_388);
      glu::VarType::~VarType(&local_3a0);
      glu::VarType::~VarType((VarType *)&group_3);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)&uniform_2.checkLocation,(value_type *)local_370);
      uVar3 = rng_2.m_rnd._8_8_;
      pUVar17 = (UniformLocationCase *)operator_new(0x90);
      pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      pcVar16 = (char *)std::__cxx11::string::c_str();
      pcVar19 = (char *)std::__cxx11::string::c_str();
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&uniform_2.checkLocation);
      tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)pUVar17);
      Functional::anon_unknown_0::UniformInfo::~UniformInfo((UniformInfo *)local_370);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&uniform_2.checkLocation);
      std::__cxx11::string::~string((string *)local_2e8);
    }
  }
  de::Random::~Random((Random *)&type_2);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "struct","Struct location, random contents & declaration location");
  rng_3.m_rnd._8_8_ = pTVar20;
  de::Random::Random((Random *)local_3d0,iVar4 + 0x4001);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)rng_3.m_rnd._8_8_);
  for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 0x10;
      name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
    de::toString<int>((string *)&declareLoc,(int *)(name_3.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                   "case_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &declareLoc);
    std::__cxx11::string::~string((string *)&declareLoc);
    SVar6 = de::Random::getUint32((Random *)local_3d0);
    verifyLoc = SVar6 & SHADERSTAGE_BOTH;
    SVar6 = de::Random::getUint32((Random *)local_3d0);
    location = SVar6 & SHADERSTAGE_BOTH | verifyLoc;
    SVar7 = de::Random::getUint32((Random *)local_3d0);
    structProto._4_4_ = SVar7 & SHADERSTAGE_BOTH & location;
    if (verifyLoc == SHADERSTAGE_NONE) {
      local_c64 = -1;
    }
    else {
      local_c64 = de::Random::getInt((Random *)local_3d0,0,0x3fa);
    }
    structProto._0_4_ = local_c64;
    pSVar21 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar21,"S");
    local_430 = pSVar21;
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (&this->structTypes,&local_430);
    pSVar21 = local_430;
    iVar5 = de::Random::getInt((Random *)local_3d0,0,0x18);
    createVarType(&local_448,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"a",&local_448);
    glu::VarType::~VarType(&local_448);
    pSVar21 = local_430;
    iVar5 = de::Random::getInt((Random *)local_3d0,0,0x18);
    createVarType(&local_460,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"b",&local_460);
    glu::VarType::~VarType(&local_460);
    pSVar21 = local_430;
    iVar5 = de::Random::getInt((Random *)local_3d0,0,0x18);
    createVarType(&local_478,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"c",&local_478);
    glu::VarType::~VarType(&local_478);
    pSVar21 = local_430;
    iVar5 = de::Random::getInt((Random *)local_3d0,0,0x18);
    createVarType(&local_490,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"d",&local_490);
    glu::VarType::~VarType(&local_490);
    pSVar21 = local_430;
    iVar5 = de::Random::getInt((Random *)local_3d0,0,0x18);
    createVarType((VarType *)
                  &config_3.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember
              (pSVar21,"e",
               (VarType *)
               &config_3.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::VarType::~VarType
              ((VarType *)
               &config_3.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              *)local_4c0);
    glu::VarType::VarType((VarType *)&group_4,local_430);
    Functional::anon_unknown_0::UniformInfo::UniformInfo
              (&local_4e8,(VarType *)&group_4,location,verifyLoc,structProto._4_4_,(int)structProto)
    ;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_4c0,&local_4e8);
    Functional::anon_unknown_0::UniformInfo::~UniformInfo(&local_4e8);
    glu::VarType::~VarType((VarType *)&group_4);
    uVar3 = rng_3.m_rnd._8_8_;
    pUVar17 = (UniformLocationCase *)operator_new(0x90);
    pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    pcVar19 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_4c0);
    tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)pUVar17);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_4c0);
    std::__cxx11::string::~string((string *)local_3f8);
  }
  de::Random::~Random((Random *)local_3d0);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_struct","Struct location specified with use, single shader stage");
  rng_4.m_rnd._8_8_ = pTVar20;
  de::Random::Random((Random *)local_518,iVar4 + 0x5001);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)rng_4.m_rnd._8_8_);
  for (name_4.field_2._12_4_ = 0; (int)name_4.field_2._12_4_ < 0x10;
      name_4.field_2._12_4_ = name_4.field_2._12_4_ + 1) {
    de::toString<int>((string *)local_560,(int *)(name_4.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                   "case_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_560);
    std::__cxx11::string::~string((string *)local_560);
    local_ed0 = de::Random::getInt((Random *)local_518,0,0x3c3);
    SVar7 = de::Random::getUint32((Random *)local_518);
    SVar7 = SVar7 & SHADERSTAGE_BOTH;
    SVar8 = de::Random::getUint32((Random *)local_518);
    SVar8 = SVar8 & SHADERSTAGE_BOTH;
    SVar9 = de::Random::getUint32((Random *)local_518);
    SVar9 = SVar9 & SHADERSTAGE_BOTH;
    SVar10 = de::Random::getUint32((Random *)local_518);
    SVar10 = SVar10 & SHADERSTAGE_BOTH;
    SVar11 = de::Random::getUint32((Random *)local_518);
    SVar12 = de::Random::getUint32((Random *)local_518);
    SVar27 = SVar12 & SHADERSTAGE_BOTH | SVar8;
    SVar12 = de::Random::getUint32((Random *)local_518);
    SVar28 = SVar12 & SHADERSTAGE_BOTH | SVar9;
    SVar12 = de::Random::getUint32((Random *)local_518);
    declareLocation_ = SVar12 & SHADERSTAGE_BOTH | SVar10;
    SVar11 = SVar11 & SHADERSTAGE_BOTH | SVar7 | SVar27 | SVar28 | declareLocation_;
    SVar12 = SVar27 | SVar28 | declareLocation_;
    SVar27 = de::Random::getUint32((Random *)local_518);
    testTypes[3]._0_4_ = SVar27 & SVar11;
    SVar27 = de::Random::getUint32((Random *)local_518);
    testTypes[3]._4_4_ = SVar27 & SVar12;
    SVar27 = de::Random::getUint32((Random *)local_518);
    SVar13 = de::Random::getUint32((Random *)local_518);
    pSVar21 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar21,"Type0");
    local_5c8 = pSVar21;
    pSVar21 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar21,"Type1");
    testTypes[0] = pSVar21;
    pSVar21 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar21,"Type2");
    testTypes[1] = pSVar21;
    pSVar21 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar21,"Type3");
    testTypes[2] = pSVar21;
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (&this->structTypes,&local_5c8);
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (&this->structTypes,testTypes);
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (&this->structTypes,testTypes + 1);
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (&this->structTypes,testTypes + 2);
    pSVar21 = local_5c8;
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_5e0,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"a",&local_5e0);
    glu::VarType::~VarType(&local_5e0);
    pSVar21 = local_5c8;
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_5f8,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"b",&local_5f8);
    glu::VarType::~VarType(&local_5f8);
    pSVar21 = local_5c8;
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_610,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"c",&local_610);
    glu::VarType::~VarType(&local_610);
    pSVar21 = local_5c8;
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_628,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"d",&local_628);
    glu::VarType::~VarType(&local_628);
    pSVar21 = local_5c8;
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_640,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"e",&local_640);
    glu::VarType::~VarType(&local_640);
    pSVar21 = testTypes[0];
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_658,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"a",&local_658);
    glu::VarType::~VarType(&local_658);
    pSVar21 = testTypes[0];
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_670,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"b",&local_670);
    glu::VarType::~VarType(&local_670);
    pSVar21 = testTypes[0];
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_688,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"c",&local_688);
    glu::VarType::~VarType(&local_688);
    pSVar21 = testTypes[0];
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_6a0,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"d",&local_6a0);
    glu::VarType::~VarType(&local_6a0);
    pSVar21 = testTypes[0];
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_6b8,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"e",&local_6b8);
    glu::VarType::~VarType(&local_6b8);
    pSVar21 = testTypes[1];
    glu::VarType::VarType(&local_6d0,local_5c8);
    glu::StructType::addMember(pSVar21,"a",&local_6d0);
    glu::VarType::~VarType(&local_6d0);
    pSVar21 = testTypes[1];
    glu::VarType::VarType(&local_6e8,testTypes[0]);
    glu::StructType::addMember(pSVar21,"b",&local_6e8);
    glu::VarType::~VarType(&local_6e8);
    pSVar21 = testTypes[1];
    iVar5 = de::Random::getInt((Random *)local_518,0,0x18);
    createVarType(&local_700,primitiveTypes[(long)iVar5 + -2]);
    glu::StructType::addMember(pSVar21,"c",&local_700);
    glu::VarType::~VarType(&local_700);
    pSVar21 = testTypes[2];
    glu::VarType::VarType
              ((VarType *)
               &config_4.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,testTypes[1]);
    glu::StructType::addMember
              (pSVar21,"a",
               (VarType *)
               &config_4.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::VarType::~VarType
              ((VarType *)
               &config_4.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              *)local_730);
    glu::VarType::VarType(&local_770,local_5c8);
    local_ea0 = local_ed0;
    if (SVar7 == SHADERSTAGE_NONE) {
      local_ea0 = -1;
    }
    Functional::anon_unknown_0::UniformInfo::UniformInfo
              (&local_758,&local_770,SVar11,SVar7,(ShaderStage)testTypes[3],local_ea0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_730,&local_758);
    Functional::anon_unknown_0::UniformInfo::~UniformInfo(&local_758);
    glu::VarType::~VarType(&local_770);
    glu::VarType::VarType(&local_7b0,testTypes[0]);
    if (SVar8 == SHADERSTAGE_NONE) {
      local_eb0 = -1;
    }
    else {
      local_eb0 = local_ed0 + 5;
    }
    Functional::anon_unknown_0::UniformInfo::UniformInfo
              (&local_798,&local_7b0,SVar12,SVar8,testTypes[3]._4_4_,local_eb0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_730,&local_798);
    Functional::anon_unknown_0::UniformInfo::~UniformInfo(&local_798);
    glu::VarType::~VarType(&local_7b0);
    glu::VarType::VarType(&local_7f0,testTypes[1]);
    if (SVar9 == SHADERSTAGE_NONE) {
      local_ec0 = -1;
    }
    else {
      local_ec0 = local_ed0 + 0x10;
    }
    Functional::anon_unknown_0::UniformInfo::UniformInfo
              (&local_7d8,&local_7f0,SVar28 | declareLocation_,SVar9,
               SVar27 & (SVar28 | declareLocation_),local_ec0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_730,&local_7d8);
    Functional::anon_unknown_0::UniformInfo::~UniformInfo(&local_7d8);
    glu::VarType::~VarType(&local_7f0);
    glu::VarType::VarType((VarType *)&group_5,testTypes[2]);
    if (SVar10 == SHADERSTAGE_NONE) {
      local_ed0 = -1;
    }
    else {
      local_ed0 = local_ed0 + 0x1b;
    }
    Functional::anon_unknown_0::UniformInfo::UniformInfo
              (&local_818,(VarType *)&group_5,declareLocation_,SVar10,SVar13 & declareLocation_,
               local_ed0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_730,&local_818);
    Functional::anon_unknown_0::UniformInfo::~UniformInfo(&local_818);
    glu::VarType::~VarType((VarType *)&group_5);
    uVar3 = rng_4.m_rnd._8_8_;
    pUVar17 = (UniformLocationCase *)operator_new(0x90);
    pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    pcVar19 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_730);
    tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)pUVar17);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_730);
    std::__cxx11::string::~string((string *)local_540);
  }
  de::Random::~Random((Random *)local_518);
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_max",
             "Maximum & minimum location");
  tcu::TestNode::addChild((TestNode *)this,pTVar15);
  for (stageNdx_3 = 0; stageNdx_3 < 0x1c; stageNdx_3 = stageNdx_3 + 1) {
    DVar1 = primitiveTypes[(long)stageNdx_3 + -2];
    for (name_5.field_2._12_4_ = 0; (int)name_5.field_2._12_4_ < 2;
        name_5.field_2._12_4_ = name_5.field_2._12_4_ + 1) {
      pcVar16 = glu::getDataTypeName(DVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8a8,pcVar16,
                 (allocator<char> *)
                 ((long)&config_5.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_888,&local_8a8,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
                     &local_888,*(char **)(&baseSeed + (long)(int)name_5.field_2._12_4_ * 2));
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&config_5.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_8c8);
      createVarType(&local_908,DVar1);
      SVar7 = checkStages[(long)(int)name_5.field_2._12_4_ + -2];
      Functional::anon_unknown_0::UniformInfo::UniformInfo
                (&local_8f0,&local_908,SVar7,SVar7,SVar7,0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_8c8,&local_8f0);
      Functional::anon_unknown_0::UniformInfo::~UniformInfo(&local_8f0);
      glu::VarType::~VarType(&local_908);
      pUVar17 = (UniformLocationCase *)operator_new(0x90);
      local_949 = 1;
      pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::operator+(&local_928,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
                     "_min");
      pcVar16 = (char *)std::__cxx11::string::c_str();
      std::operator+(&local_948,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
                     "_min");
      pcVar19 = (char *)std::__cxx11::string::c_str();
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_8c8);
      local_949 = 0;
      tcu::TestNode::addChild(pTVar15,(TestNode *)pUVar17);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_928);
      pTVar22 = (TestNode *)operator_new(0x90);
      pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::operator+(&local_970,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
                     "_max");
      pcVar16 = (char *)std::__cxx11::string::c_str();
      std::operator+(&local_990,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
                     "_max");
      pcVar19 = (char *)std::__cxx11::string::c_str();
      Functional::anon_unknown_0::MaxUniformLocationCase::MaxUniformLocationCase
                ((MaxUniformLocationCase *)pTVar22,pTVar14,pRVar18,pcVar16,pcVar19,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_8c8);
      tcu::TestNode::addChild(pTVar15,pTVar22);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_970);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_8c8);
      std::__cxx11::string::~string((string *)local_868);
    }
  }
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"link"
             ,"Location specified independently from use");
  rng_5.m_rnd._8_8_ = pTVar20;
  de::Random::Random((Random *)local_9b0,iVar4 + 0x82e1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)rng_5.m_rnd._8_8_);
  for (name_6.field_2._12_4_ = 0; (int)name_6.field_2._12_4_ < 10;
      name_6.field_2._12_4_ = name_6.field_2._12_4_ + 1) {
    de::toString<int>((string *)
                      &config_6.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (int *)(name_6.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "case_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &config_6.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &config_6.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              *)&locations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    Functional::anon_unknown_0::shuffledRange
              ((vector<int,_std::allocator<int>_> *)&layoutLoc_1,0,0x400,
               name_6.field_2._12_4_ * 100 + 0x1234);
    for (declareLoc_1 = SHADERSTAGE_NONE; uVar3 = rng_5.m_rnd._8_8_, (int)declareLoc_1 < 0x20;
        declareLoc_1 = declareLoc_1 + SHADERSTAGE_VERTEX) {
      SVar8 = de::Random::getUint32((Random *)local_9b0);
      SVar8 = SVar8 & SHADERSTAGE_BOTH;
      SVar7 = de::Random::getUint32((Random *)local_9b0);
      uniform_3.location = SVar7 & SHADERSTAGE_BOTH | SVar8;
      SVar7 = de::Random::getUint32((Random *)local_9b0);
      uniform_3.checkLocation = SVar7 & uniform_3.location & SHADERSTAGE_BOTH;
      iVar4 = de::Random::getInt((Random *)local_9b0,0,0x18);
      createVarType((VarType *)
                    &negativeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.field_0x8,primitiveTypes[(long)iVar4 + -2]);
      iVar4 = uniform_3.location;
      SVar7 = uniform_3.checkLocation;
      if (SVar8 == SHADERSTAGE_NONE) {
        local_f90 = -1;
      }
      else {
        pvVar23 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)&layoutLoc_1);
        local_f90 = *pvVar23;
      }
      Functional::anon_unknown_0::UniformInfo::UniformInfo
                ((UniformInfo *)local_a60,
                 (VarType *)
                 &negativeGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,iVar4,SVar8,SVar7,local_f90);
      glu::VarType::~VarType
                ((VarType *)
                 &negativeGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)&locations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)local_a60);
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)&layoutLoc_1);
      Functional::anon_unknown_0::UniformInfo::~UniformInfo((UniformInfo *)local_a60);
    }
    pUVar17 = (UniformLocationCase *)operator_new(0x90);
    pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    pcVar19 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar17,pTVar14,pRVar18,pcVar16,pcVar19,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)&locations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)pUVar17);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&layoutLoc_1);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)&locations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_9d8);
  }
  de::Random::~Random((Random *)local_9b0);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative","Negative tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &es31Group.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_a88,
             pTVar20);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es31"
             ,"GLSL ES 3.1 Negative tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&shaderLibrary.m_contextInfo + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_aa0,
             pTVar20);
  pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar24 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)
             &negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pTVar14,pRVar18,pCVar24);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ad8,
             (ShaderLibrary *)
             &negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"shaders/es31/uniform_location.test"
            );
  for (es32Group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._12_4_ = 0;
      uVar2 = es32Group.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _12_4_,
      sVar25 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ad8),
      (int)uVar2 < (int)sVar25;
      es32Group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      ._12_4_ = es32Group.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._12_4_ + 1) {
    pTVar15 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                             *)local_aa0)->super_TestNode;
    ppTVar26 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ad8,
                          (long)(int)es32Group.
                                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                     .m_data._12_4_);
    tcu::TestNode::addChild(pTVar15,*ppTVar26);
  }
  pTVar15 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_a88)->super_TestNode;
  pTVar22 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_aa0)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar22);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ad8);
  deqp::gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_aa0);
  pTVar20 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar20,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es32"
             ,"GLSL ES 3.2 Negative tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&shaderLibrary_1.m_contextInfo + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_af0,
             pTVar20);
  pTVar14 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar18 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar24 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)
             &negativeCases_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pTVar14,pRVar18,pCVar24);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b28,
             (ShaderLibrary *)
             &negativeCases_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"shaders/es32/uniform_location.test"
            );
  for (local_b2c = 0;
      sVar25 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b28),
      local_b2c < (int)sVar25; local_b2c = local_b2c + 1) {
    pTVar15 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                             *)local_af0)->super_TestNode;
    ppTVar26 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b28,
                          (long)local_b2c);
    tcu::TestNode::addChild(pTVar15,*ppTVar26);
  }
  pTVar15 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_a88)->super_TestNode;
  pTVar22 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_af0)->super_TestNode;
  tcu::TestNode::addChild(pTVar15,pTVar22);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b28);
  deqp::gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &negativeCases_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_af0);
  pTVar15 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_a88)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar15);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_a88);
  return extraout_EAX;
}

Assistant:

void UniformLocationTests::init (void)
{
	using namespace glu;

	const UniformInfo::ShaderStage checkStages[]	= { UniformInfo::SHADERSTAGE_VERTEX, UniformInfo::SHADERSTAGE_FRAGMENT };
	const char*						stageNames[]	= {"vertex", "fragment"};
	const int						maxLocations	= 1024;
	const int						baseSeed		= m_context.getTestContext().getCommandLine().getBaseSeed();

	const DataType					primitiveTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,

		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,

		TYPE_UINT,
		TYPE_UINT_VEC2,
		TYPE_UINT_VEC3,
		TYPE_UINT_VEC4,

		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4,

		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4,

		TYPE_SAMPLER_2D,
		TYPE_INT_SAMPLER_2D,
		TYPE_UINT_SAMPLER_2D,
	};

	const int maxPrimitiveTypeNdx = DE_LENGTH_OF_ARRAY(primitiveTypes) - 4;
	DE_ASSERT(primitiveTypes[maxPrimitiveTypeNdx] == TYPE_FLOAT_MAT4);

	// Primitive type cases with trivial linkage
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "basic", "Location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x1001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x2001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{

				const string		name	= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(createVarType(type), 8),
												checkStages[stageNdx],
												checkStages[stageNdx],
												checkStages[stageNdx],
												rng.getInt(0, maxLocations-1-8));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x3001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				// stay comfortably within minimum max uniform component count (896 in fragment) and sampler count with all types
				const int			arraySize	= (getDataTypeScalarSize(type) > 4 || isDataTypeSampler(type)) ? 3 : 7;

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(VarType(createVarType(type), arraySize), arraySize),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1-arraySize*arraySize));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "struct", "Struct location, random contents & declaration location");
		de::Random					rng		(baseSeed + 0x4001);
		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);

			const Stage		layoutLoc	= Stage(rng.getUint32()&0x3);
			const Stage		declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
			const Stage		verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);
			const int		location	= layoutLoc ? rng.getInt(0, maxLocations-1-5) : -1;

			StructType*		structProto = new StructType("S");

			structTypes.push_back(structProto);

			structProto->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(structProto),
											 declareLoc,
											 layoutLoc,
											 verifyLoc,
											 location));
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_struct", "Struct location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x5001);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);
			const int		baseLoc		= rng.getInt(0, maxLocations-1-60);

			// Structs need to be added in the order of their declaration
			const Stage		layoutLocs[]=
			{
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
			};

			const deUint32	tempDecl[] =
			{
				(rng.getUint32()&0x3) | layoutLocs[0],
				(rng.getUint32()&0x3) | layoutLocs[1],
				(rng.getUint32()&0x3) | layoutLocs[2],
				(rng.getUint32()&0x3) | layoutLocs[3],
			};

			// Component structs need to be declared if anything using them is declared
			const Stage		declareLocs[] =
			{
				Stage(tempDecl[0] | tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[3]),
			};

			const Stage		verifyLocs[] =
			{
				Stage(rng.getUint32()&0x3 & declareLocs[0]),
				Stage(rng.getUint32()&0x3 & declareLocs[1]),
				Stage(rng.getUint32()&0x3 & declareLocs[2]),
				Stage(rng.getUint32()&0x3 & declareLocs[3]),
			};

			StructType*		testTypes[]	=
			{
				new StructType("Type0"),
				new StructType("Type1"),
				new StructType("Type2"),
				new StructType("Type3"),
			};

			structTypes.push_back(testTypes[0]);
			structTypes.push_back(testTypes[1]);
			structTypes.push_back(testTypes[2]);
			structTypes.push_back(testTypes[3]);

			testTypes[0]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[1]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[2]->addMember("a", VarType(testTypes[0]));
			testTypes[2]->addMember("b", VarType(testTypes[1]));
			testTypes[2]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[3]->addMember("a", VarType(testTypes[2]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(testTypes[0]),
											 declareLocs[0],
											 layoutLocs[0],
											 verifyLocs[0],
											 layoutLocs[0] ? baseLoc : -1));

				config.push_back(UniformInfo(VarType(testTypes[1]),
											 declareLocs[1],
											 layoutLocs[1],
											 verifyLocs[1],
											 layoutLocs[1] ? baseLoc+5 : -1));

				config.push_back(UniformInfo(VarType(testTypes[2]),
											 declareLocs[2],
											 layoutLocs[2],
											 verifyLocs[2],
											 layoutLocs[2] ? baseLoc+16 : -1));

				config.push_back(UniformInfo(VarType(testTypes[3]),
											 declareLocs[3],
											 layoutLocs[3],
											 verifyLocs[3],
											 layoutLocs[3] ? baseLoc+27 : -1));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Min/Max location
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, "min_max", "Maximum & minimum location");

		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				vector<UniformInfo> config;

				config.push_back(UniformInfo(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 0));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_min").c_str(), (name+"_min").c_str(), config));

				group->addChild(new MaxUniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_max").c_str(), (name+"_max").c_str(), config));
			}
		}
	}

	// Link
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "link", "Location specified independently from use");
		de::Random					rng		(baseSeed + 0x82e1);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 10; caseNdx++)
		{
			const string		name		= "case_" + de::toString(caseNdx);
			vector<UniformInfo> config;

			vector<int>			locations	= shuffledRange(0, maxLocations, 0x1234 + caseNdx*100);

			for (int count = 0; count < 32; count++)
			{
				typedef UniformInfo::ShaderStage Stage;

				const Stage			layoutLoc	= Stage(rng.getUint32()&0x3);
				const Stage			declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
				const Stage			verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);

				const UniformInfo	uniform		(createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]),
												 declareLoc,
												 layoutLoc,
												 verifyLoc,
												 (layoutLoc!=0) ? locations.back() : -1);

				config.push_back(uniform);
				locations.pop_back();
			}
			group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
		}
	}

	// Negative
	{
		de::MovePtr<tcu::TestCaseGroup>	negativeGroup			(new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests"));

		{
			de::MovePtr<tcu::TestCaseGroup>	es31Group		(new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es31/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es31Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es31Group.release());
		}

		{
			de::MovePtr<tcu::TestCaseGroup>	es32Group		(new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es32/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es32Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es32Group.release());
		}

		addChild(negativeGroup.release());
	}
}